

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

void greatest_get_report(greatest_report_t *report)

{
  greatest_report_t *report_local;
  
  if (report != (greatest_report_t *)0x0) {
    report->passed = greatest_info.passed;
    report->failed = greatest_info.failed;
    report->skipped = greatest_info.skipped;
    report->assertions = greatest_info.assertions;
  }
  return;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}